

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strongly_connected_components.h
# Opt level: O0

void __thiscall wasm::SCCs<IntIt,_GraphSCCs>::SCC::Iterator::setVal(Iterator *this)

{
  bool bVar1;
  reference __t;
  _Optional_payload_base<unsigned_int> local_1c;
  Iterator *local_10;
  Iterator *this_local;
  
  local_10 = this;
  bVar1 = isEnd(this);
  if (bVar1) {
    std::optional<unsigned_int>::operator=(&this->val);
  }
  else {
    __t = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(&this->parent->stack);
    std::optional<unsigned_int>::optional<unsigned_int_&,_true>
              ((optional<unsigned_int> *)&local_1c,__t);
    (this->val).super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> = local_1c;
  }
  return;
}

Assistant:

void setVal() {
        if (isEnd()) {
          val = std::nullopt;
        } else {
          val = parent->stack.back();
        }
      }